

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O2

int AF_A_SerpentMeleeAttack
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  VM_UBYTE VVar1;
  DObject *this;
  DAngle angle;
  bool bVar2;
  int iVar3;
  int iVar4;
  AActor *pAVar5;
  long lVar6;
  char *__assertion;
  AActor *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  FSoundID local_68;
  FName local_64;
  undefined8 local_60;
  VMValue params [3];
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00543168;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_00542fa6:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00543168;
        }
      }
      if (numparam == 1) goto LAB_00543027;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00543158;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00543168;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_00543158;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00543027:
        obj = &this_00->target;
        pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar5 != (AActor *)0x0) {
          bVar2 = AActor::CheckMeleeRange(this_00);
          if (bVar2) {
            iVar3 = FRandom::HitDice(&pr_serpentmeattack,5);
            pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
            local_64.Index = 0x84;
            local_60 = 0;
            angle.Degrees._4_4_ = extraout_XMM0_Db;
            angle.Degrees._0_4_ = extraout_XMM0_Da;
            iVar4 = P_DamageMobj(pAVar5,this_00,this_00,iVar3,&local_64,0,angle);
            if (0 < iVar4) {
              iVar3 = iVar4;
            }
            pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
            P_TraceBleed(iVar3,pAVar5,this_00);
            local_68.ID = S_FindSound("SerpentMeleeHit");
            S_Sound(this_00,4,&local_68,1.0,1.0);
          }
          iVar3 = FRandom::operator()(&pr_serpentmeattack);
          if (iVar3 < 0x60) {
            params[0].field_0._8_4_ = 1;
            params[0].field_0.field_3.Type = '\x03';
            params[1].field_0.field_3.Type = '\x03';
            params[2].field_0.field_1.a = (void *)0x0;
            params[2].field_0.field_1.atag = 8;
            params[2].field_0.field_3.Type = '\x03';
            params[0].field_0._0_8_ = this_00;
            params[1].field_0._0_8_ = this_00;
            params[1].field_0._8_4_ = params[0].field_0._8_4_;
            VMFrameStack::Call(stack,&A_SerpentCheckForAttack_VMPtr->super_VMFunction,params,3,
                               (VMReturn *)0x0,0,(VMException **)0x0);
            lVar6 = 0x20;
            do {
              VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar6));
              lVar6 = lVar6 + -0x10;
            } while (lVar6 != -0x10);
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00543168;
    }
    if (this_00 == (AActor *)0x0) goto LAB_00542fa6;
  }
LAB_00543158:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00543168:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                ,0xbf,"int AF_A_SerpentMeleeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentMeleeAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
	{
		return 0;
	}
	if (self->CheckMeleeRange ())
	{
		int damage = pr_serpentmeattack.HitDice (5);
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		S_Sound (self, CHAN_BODY, "SerpentMeleeHit", 1, ATTN_NORM);
	}
	if (pr_serpentmeattack() < 96)
	{
		CALL_ACTION(A_SerpentCheckForAttack, self);
	}
	return 0;
}